

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall Uniforms::unflagChange(Uniforms *this)

{
  _Base_ptr p_Var1;
  Camera *pCVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  
  if (this->m_change == true) {
    this->m_change = false;
    for (p_Var4 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      p_Var1 = p_Var4[2]._M_left;
      bVar5 = p_Var4[3]._M_left != p_Var1;
      if (bVar5) {
        p_Var3 = p_Var1->_M_parent;
        p_Var4[4]._M_left = *(_Base_ptr *)p_Var1;
        p_Var4[4]._M_right = p_Var3;
        std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::pop_front
                  ((deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   (p_Var4 + 2));
      }
      *(bool *)((long)&p_Var4[5]._M_parent + 1) = bVar5;
      this->m_change = (bool)(this->m_change | bVar5);
    }
  }
  for (p_Var4 = (this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    *(undefined1 *)(*(long *)(p_Var4 + 2) + 0x20) = 0;
  }
  pCVar2 = (this->super_Scene).activeCamera;
  if (pCVar2 != (Camera *)0x0) {
    (pCVar2->super_Node).bChange = false;
  }
  return;
}

Assistant:

void Uniforms::unflagChange() {
    if (m_change) {
        m_change = false;

        // Flag all user uniforms as NOT changed
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it)
            m_change += it->second.check();
    }

    for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it)
        it->second->bChange = false;

    if (activeCamera)
        activeCamera->bChange = false;
}